

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O3

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::try_move_from(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                *this,flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *other)

{
  memory_resource *pmVar1;
  pointer_type pcVar2;
  char cVar3;
  
  pmVar1 = (other->buffer_).v1_._M_resource;
  if (pmVar1 != (this->buffer_).v1_._M_resource) {
    cVar3 = (**(code **)(*(long *)pmVar1 + 0x20))();
    if (cVar3 == '\0') {
      copy_from(this,other);
      return;
    }
  }
  clear(this);
  (this->buffer_).v2_.end = (other->buffer_).v2_.end;
  pcVar2 = (other->buffer_).v2_.last;
  (this->buffer_).v2_.begin = (other->buffer_).v2_.begin;
  (this->buffer_).v2_.last = pcVar2;
  (other->buffer_).v2_.begin = (pointer_type)0x0;
  (other->buffer_).v2_.last = (pointer_type)0x0;
  (other->buffer_).v2_.end = (pointer_type)0x0;
  return;
}

Assistant:

void try_move_from(flat_forward_list &&other) {
        if (other.get_allocator() == get_allocator()) {
            move_from(std::move(other));
        } else {
            copy_from(other);
        }
    }